

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::compatible
          (ClauseMatcher *this,ILStruct *bi,MatchInfo *bq,ILStruct *ni,MatchInfo *nq)

{
  uint uVar1;
  LitInfo *pLVar2;
  long in_RCX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  uint *in_R8;
  bool bVar3;
  TermList *nb;
  uint *ngvn;
  uint nvars;
  TermList *bb;
  uint *bgvn;
  uint bvars;
  TermList *local_60;
  uint *local_58;
  int local_4c;
  TermList *local_48;
  uint *local_40;
  int local_34;
  bool local_1;
  
  pLVar2 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                     ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),(ulong)*in_RDX);
  uVar1 = pLVar2->litIndex;
  pLVar2 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                     ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),(ulong)*in_R8);
  if ((uVar1 == pLVar2->litIndex) ||
     ((pLVar2 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                          ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),(ulong)*in_RDX),
      (pLVar2->opposite & 1U) != 0 &&
      (pLVar2 = Lib::DArray<Indexing::CodeTree::LitInfo>::operator[]
                          ((DArray<Indexing::CodeTree::LitInfo> *)(in_RDI + 0x18),(ulong)*in_R8),
      (pLVar2->opposite & 1U) != 0)))) {
    local_1 = false;
  }
  else {
    local_34 = *(int *)(in_RSI + 0x10);
    local_40 = *(uint **)(in_RSI + 0x20);
    local_48 = (TermList *)(in_RDX + 2);
    local_4c = *(int *)(in_RCX + 0x10);
    local_58 = *(uint **)(in_RCX + 0x20);
    local_60 = (TermList *)(in_R8 + 2);
    while (local_34 != 0 && local_4c != 0) {
      while( true ) {
        bVar3 = false;
        if (local_34 != 0) {
          bVar3 = *local_40 < *local_58;
        }
        if (!bVar3) break;
        local_34 = local_34 + -1;
        local_40 = local_40 + 1;
        local_48 = local_48 + 1;
      }
      if (local_34 == 0) break;
      while( true ) {
        bVar3 = false;
        if (local_4c != 0) {
          bVar3 = *local_58 < *local_40;
        }
        if (!bVar3) break;
        local_4c = local_4c + -1;
        local_58 = local_58 + 1;
        local_60 = local_60 + 1;
      }
      while( true ) {
        bVar3 = false;
        if ((local_34 != 0) && (bVar3 = false, local_4c != 0)) {
          bVar3 = *local_40 == *local_58;
        }
        if (!bVar3) break;
        bVar3 = Kernel::TermList::operator!=(local_48,local_60);
        if (bVar3) {
          return false;
        }
        local_34 = local_34 + -1;
        local_40 = local_40 + 1;
        local_48 = local_48 + 1;
        local_4c = local_4c + -1;
        local_58 = local_58 + 1;
        local_60 = local_60 + 1;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::compatible(ILStruct* bi, MatchInfo* bq, ILStruct* ni, MatchInfo* nq)
{
  if( lInfos[bq->liIndex].litIndex==lInfos[nq->liIndex].litIndex ||
      (lInfos[bq->liIndex].opposite && lInfos[nq->liIndex].opposite) ) {
    return false;
  }

  unsigned bvars=bi->varCnt;
  unsigned* bgvn=bi->sortedGlobalVarNumbers;
  TermList* bb=bq->bindings;

  unsigned nvars=ni->varCnt;
  unsigned* ngvn=ni->sortedGlobalVarNumbers;
  TermList* nb=nq->bindings;

  while(bvars && nvars) {
    while(bvars && *bgvn<*ngvn) {
      bvars--;
      bgvn++;
      bb++;
    }
    if(!bvars) {
      break;
    }
    while(nvars && *bgvn>*ngvn) {
      nvars--;
      ngvn++;
      nb++;
    }
    while(bvars && nvars && *bgvn==*ngvn) {
      if(*bb!=*nb) {
	return false;
      }
      bvars--;
      bgvn++;
      bb++;
      nvars--;
      ngvn++;
      nb++;
    }
  }

  return true;
}